

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ulong *puVar29;
  int iVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  undefined4 uVar37;
  ulong unaff_RBX;
  size_t mask;
  Scene *pSVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_c61;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  size_t local_c50;
  RayK<8> *local_c48;
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  ulong local_c00;
  ulong local_bf8;
  ulong local_bf0;
  ulong local_be8;
  ulong local_be0;
  ulong local_bd8;
  ulong *local_bd0;
  Scene *local_bc8;
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  ulong local_b68;
  ulong local_b60;
  ulong *local_b58;
  RTCFilterFunctionNArguments local_b50;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  int local_ab0;
  int iStack_aac;
  int iStack_aa8;
  int iStack_aa4;
  int local_aa0;
  int iStack_a9c;
  int iStack_a98;
  int iStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  undefined4 local_a30;
  undefined4 uStack_a2c;
  undefined4 uStack_a28;
  undefined4 uStack_a24;
  undefined4 local_a20;
  undefined4 uStack_a1c;
  undefined4 uStack_a18;
  undefined4 uStack_a14;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar37 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_bc0._4_4_ = uVar37;
  local_bc0._0_4_ = uVar37;
  local_bc0._8_4_ = uVar37;
  local_bc0._12_4_ = uVar37;
  auVar109 = ZEXT1664(local_bc0);
  local_a20 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_a30 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_a70 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a80 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_a40 = local_a70 * 0.99999964;
  fVar96 = local_a80 * 0.99999964;
  local_a50._4_4_ = fVar96;
  local_a50._0_4_ = fVar96;
  fStack_a48 = fVar96;
  fStack_a44 = fVar96;
  local_a60 = local_a90 * 0.99999964;
  local_a70 = local_a70 * 1.0000004;
  local_a80 = local_a80 * 1.0000004;
  local_a90 = local_a90 * 1.0000004;
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar47 = uVar35 ^ 0x10;
  uVar42 = uVar39 ^ 0x10;
  uVar44 = uVar40 ^ 0x10;
  local_aa0 = (tray->tnear).field_0.i[k];
  local_ab0 = (tray->tfar).field_0.i[k];
  iVar30 = 1 << ((uint)k & 0x1f);
  auVar59._4_4_ = iVar30;
  auVar59._0_4_ = iVar30;
  auVar59._8_4_ = iVar30;
  auVar59._12_4_ = iVar30;
  auVar59._16_4_ = iVar30;
  auVar59._20_4_ = iVar30;
  auVar59._24_4_ = iVar30;
  auVar59._28_4_ = iVar30;
  auVar18 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar59 = vpand_avx2(auVar59,auVar18);
  local_940 = vpcmpeqd_avx2(auVar59,auVar18);
  puVar29 = local_7f8;
  local_c50 = k;
  local_c48 = ray;
  local_c00 = uVar44;
  local_bf8 = uVar42;
  local_bf0 = uVar47;
  local_be8 = uVar40;
  local_be0 = uVar39;
  local_bd8 = uVar35;
  iStack_aac = local_ab0;
  iStack_aa8 = local_ab0;
  iStack_aa4 = local_ab0;
  iStack_a9c = local_aa0;
  iStack_a98 = local_aa0;
  iStack_a94 = local_aa0;
  fStack_a8c = local_a90;
  fStack_a88 = local_a90;
  fStack_a84 = local_a90;
  fStack_a7c = local_a80;
  fStack_a78 = local_a80;
  fStack_a74 = local_a80;
  fStack_a6c = local_a70;
  fStack_a68 = local_a70;
  fStack_a64 = local_a70;
  fStack_a5c = local_a60;
  fStack_a58 = local_a60;
  fStack_a54 = local_a60;
  fStack_a3c = local_a40;
  fStack_a38 = local_a40;
  fStack_a34 = local_a40;
  uStack_a2c = local_a30;
  uStack_a28 = local_a30;
  uStack_a24 = local_a30;
  uStack_a1c = local_a20;
  uStack_a18 = local_a20;
  uStack_a14 = local_a20;
  do {
    local_b58 = puVar29;
    if (local_b58 == &local_800) break;
    local_bd0 = local_b58 + -1;
    uVar46 = local_b58[-1];
    do {
      if ((uVar46 & 8) == 0) {
        uVar31 = uVar46 & 0xfffffffffffffff0;
        uVar37 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar51._4_4_ = uVar37;
        auVar51._0_4_ = uVar37;
        auVar51._8_4_ = uVar37;
        auVar51._12_4_ = uVar37;
        auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar35),auVar51,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar35));
        auVar52 = vsubps_avx(auVar52,auVar109._0_16_);
        auVar60._0_4_ = auVar52._0_4_ * local_a40;
        auVar60._4_4_ = auVar52._4_4_ * fStack_a3c;
        auVar60._8_4_ = auVar52._8_4_ * fStack_a38;
        auVar60._12_4_ = auVar52._12_4_ * fStack_a34;
        auVar52._4_4_ = iStack_a9c;
        auVar52._0_4_ = local_aa0;
        auVar52._8_4_ = iStack_a98;
        auVar52._12_4_ = iStack_a94;
        auVar52 = vmaxps_avx(auVar52,auVar60);
        auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar39),auVar51,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar39));
        auVar20._4_4_ = uStack_a1c;
        auVar20._0_4_ = local_a20;
        auVar20._8_4_ = uStack_a18;
        auVar20._12_4_ = uStack_a14;
        auVar19 = vsubps_avx(auVar19,auVar20);
        auVar66._0_4_ = auVar19._0_4_ * (float)local_a50._0_4_;
        auVar66._4_4_ = auVar19._4_4_ * (float)local_a50._4_4_;
        auVar66._8_4_ = auVar19._8_4_ * fStack_a48;
        auVar66._12_4_ = auVar19._12_4_ * fStack_a44;
        auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar40),auVar51,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar40));
        auVar3._4_4_ = uStack_a2c;
        auVar3._0_4_ = local_a30;
        auVar3._8_4_ = uStack_a28;
        auVar3._12_4_ = uStack_a24;
        auVar19 = vsubps_avx(auVar19,auVar3);
        auVar72._0_4_ = auVar19._0_4_ * local_a60;
        auVar72._4_4_ = auVar19._4_4_ * fStack_a5c;
        auVar72._8_4_ = auVar19._8_4_ * fStack_a58;
        auVar72._12_4_ = auVar19._12_4_ * fStack_a54;
        auVar19 = vmaxps_avx(auVar66,auVar72);
        auVar52 = vmaxps_avx(auVar52,auVar19);
        auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar47),auVar51,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar47));
        auVar19 = vsubps_avx(auVar19,auVar109._0_16_);
        auVar67._0_4_ = auVar19._0_4_ * local_a70;
        auVar67._4_4_ = auVar19._4_4_ * fStack_a6c;
        auVar67._8_4_ = auVar19._8_4_ * fStack_a68;
        auVar67._12_4_ = auVar19._12_4_ * fStack_a64;
        auVar19._4_4_ = iStack_aac;
        auVar19._0_4_ = local_ab0;
        auVar19._8_4_ = iStack_aa8;
        auVar19._12_4_ = iStack_aa4;
        auVar19 = vminps_avx(auVar19,auVar67);
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar42),auVar51,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar42));
        auVar60 = vsubps_avx(auVar60,auVar20);
        auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar44),auVar51,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + uVar44));
        auVar73._0_4_ = auVar60._0_4_ * local_a80;
        auVar73._4_4_ = auVar60._4_4_ * fStack_a7c;
        auVar73._8_4_ = auVar60._8_4_ * fStack_a78;
        auVar73._12_4_ = auVar60._12_4_ * fStack_a74;
        auVar60 = vsubps_avx(auVar20,auVar3);
        auVar77._0_4_ = auVar60._0_4_ * local_a90;
        auVar77._4_4_ = auVar60._4_4_ * fStack_a8c;
        auVar77._8_4_ = auVar60._8_4_ * fStack_a88;
        auVar77._12_4_ = auVar60._12_4_ * fStack_a84;
        auVar60 = vminps_avx(auVar73,auVar77);
        auVar19 = vminps_avx(auVar19,auVar60);
        if (((uint)uVar46 & 7) == 6) {
          auVar19 = vcmpps_avx(auVar52,auVar19,2);
          auVar52 = vcmpps_avx(*(undefined1 (*) [16])(uVar31 + 0xe0),auVar51,2);
          auVar60 = vcmpps_avx(auVar51,*(undefined1 (*) [16])(uVar31 + 0xf0),1);
          auVar52 = vandps_avx(auVar52,auVar60);
          auVar52 = vandps_avx(auVar52,auVar19);
        }
        else {
          auVar52 = vcmpps_avx(auVar52,auVar19,2);
        }
        auVar52 = vpslld_avx(auVar52,0x1f);
        uVar37 = vmovmskps_avx(auVar52);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar37);
      }
      if ((uVar46 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar43 = 4;
        }
        else {
          uVar31 = uVar46 & 0xfffffffffffffff0;
          lVar33 = 0;
          for (uVar46 = unaff_RBX; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
            lVar33 = lVar33 + 1;
          }
          for (uVar32 = unaff_RBX - 1 & unaff_RBX; uVar46 = *(ulong *)(uVar31 + lVar33 * 8),
              uVar32 != 0; uVar32 = uVar32 - 1 & uVar32) {
            *local_bd0 = uVar46;
            local_bd0 = local_bd0 + 1;
            lVar33 = 0;
            for (uVar46 = uVar32; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
              lVar33 = lVar33 + 1;
            }
          }
          uVar43 = 0;
        }
      }
      else {
        uVar43 = 6;
      }
    } while (uVar43 == 0);
    if (uVar43 == 6) {
      uVar43 = 0;
      local_b68 = (ulong)((uint)uVar46 & 0xf) - 8;
      bVar49 = local_b68 != 0;
      if (bVar49) {
        uVar46 = uVar46 & 0xfffffffffffffff0;
        local_b60 = 0;
        do {
          lVar36 = local_b60 * 0x50;
          pSVar38 = context->scene;
          pGVar4 = (pSVar38->geometries).items[*(uint *)(uVar46 + 0x30 + lVar36)].ptr;
          fVar96 = (pGVar4->time_range).lower;
          fVar96 = pGVar4->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0xe0) - fVar96) /
                   ((pGVar4->time_range).upper - fVar96));
          auVar52 = vroundss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),9);
          auVar52 = vminss_avx(auVar52,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
          auVar53 = vmaxss_avx(ZEXT816(0),auVar52);
          lVar34 = (long)(int)auVar53._0_4_ * 0x38;
          uVar48 = (ulong)*(uint *)(uVar46 + 4 + lVar36);
          lVar33 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar34);
          lVar34 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar34);
          auVar52 = *(undefined1 (*) [16])(lVar33 + (ulong)*(uint *)(uVar46 + lVar36) * 4);
          uVar35 = (ulong)*(uint *)(uVar46 + 0x10 + lVar36);
          auVar19 = *(undefined1 (*) [16])(lVar33 + uVar35 * 4);
          uVar39 = (ulong)*(uint *)(uVar46 + 0x20 + lVar36);
          auVar62 = *(undefined1 (*) [16])(lVar33 + uVar39 * 4);
          auVar60 = *(undefined1 (*) [16])(lVar33 + uVar48 * 4);
          uVar40 = (ulong)*(uint *)(uVar46 + 0x14 + lVar36);
          auVar20 = *(undefined1 (*) [16])(lVar33 + uVar40 * 4);
          uVar42 = (ulong)*(uint *)(uVar46 + 0x24 + lVar36);
          auVar63 = *(undefined1 (*) [16])(lVar33 + uVar42 * 4);
          uVar44 = (ulong)*(uint *)(uVar46 + 8 + lVar36);
          auVar3 = *(undefined1 (*) [16])(lVar33 + uVar44 * 4);
          uVar32 = (ulong)*(uint *)(uVar46 + 0x18 + lVar36);
          auVar51 = *(undefined1 (*) [16])(lVar33 + uVar32 * 4);
          uVar47 = (ulong)*(uint *)(uVar46 + 0x28 + lVar36);
          auVar66 = *(undefined1 (*) [16])(lVar33 + uVar47 * 4);
          uVar45 = (ulong)*(uint *)(uVar46 + 0xc + lVar36);
          auVar67 = *(undefined1 (*) [16])(lVar33 + uVar45 * 4);
          uVar41 = (ulong)*(uint *)(uVar46 + 0x1c + lVar36);
          auVar72 = *(undefined1 (*) [16])(lVar33 + uVar41 * 4);
          uVar31 = (ulong)*(uint *)(uVar46 + 0x2c + lVar36);
          auVar73 = *(undefined1 (*) [16])(lVar33 + uVar31 * 4);
          auVar77 = *(undefined1 (*) [16])(lVar34 + (ulong)*(uint *)(uVar46 + lVar36) * 4);
          auVar54 = *(undefined1 (*) [16])(lVar34 + uVar35 * 4);
          fVar96 = fVar96 - auVar53._0_4_;
          auVar53 = vunpcklps_avx(auVar52,auVar3);
          auVar3 = vunpckhps_avx(auVar52,auVar3);
          auVar55 = vunpcklps_avx(auVar60,auVar67);
          auVar60 = vunpckhps_avx(auVar60,auVar67);
          auVar52 = *(undefined1 (*) [16])(lVar34 + uVar48 * 4);
          auVar56 = vunpcklps_avx(auVar3,auVar60);
          auVar61 = vunpcklps_avx(auVar53,auVar55);
          auVar3 = vunpckhps_avx(auVar53,auVar55);
          auVar67 = vunpcklps_avx(auVar19,auVar51);
          auVar60 = vunpckhps_avx(auVar19,auVar51);
          auVar51 = vunpcklps_avx(auVar20,auVar72);
          auVar20 = vunpckhps_avx(auVar20,auVar72);
          auVar19 = *(undefined1 (*) [16])(lVar34 + uVar44 * 4);
          auVar72 = vunpcklps_avx(auVar60,auVar20);
          auVar53 = vunpcklps_avx(auVar67,auVar51);
          auVar20 = vunpckhps_avx(auVar67,auVar51);
          auVar67 = vunpcklps_avx(auVar62,auVar66);
          auVar51 = vunpckhps_avx(auVar62,auVar66);
          auVar55 = vunpcklps_avx(auVar63,auVar73);
          auVar66 = vunpckhps_avx(auVar63,auVar73);
          auVar60 = *(undefined1 (*) [16])(lVar34 + uVar45 * 4);
          auVar73 = vunpcklps_avx(auVar51,auVar66);
          auVar62 = vunpcklps_avx(auVar67,auVar55);
          auVar51 = vunpckhps_avx(auVar67,auVar55);
          auVar66 = vunpcklps_avx(auVar77,auVar19);
          auVar19 = vunpckhps_avx(auVar77,auVar19);
          auVar67 = vunpcklps_avx(auVar52,auVar60);
          auVar60 = vunpckhps_avx(auVar52,auVar60);
          auVar52 = *(undefined1 (*) [16])(lVar34 + uVar32 * 4);
          auVar77 = vunpcklps_avx(auVar19,auVar60);
          auVar55 = vunpcklps_avx(auVar66,auVar67);
          auVar60 = vunpckhps_avx(auVar66,auVar67);
          auVar67 = vunpcklps_avx(auVar54,auVar52);
          auVar66 = vunpckhps_avx(auVar54,auVar52);
          auVar52 = *(undefined1 (*) [16])(lVar34 + uVar40 * 4);
          auVar19 = *(undefined1 (*) [16])(lVar34 + uVar41 * 4);
          auVar54 = vunpcklps_avx(auVar52,auVar19);
          auVar52 = vunpckhps_avx(auVar52,auVar19);
          auVar63 = vunpcklps_avx(auVar66,auVar52);
          auVar68 = vunpcklps_avx(auVar67,auVar54);
          auVar66 = vunpckhps_avx(auVar67,auVar54);
          auVar52 = *(undefined1 (*) [16])(lVar34 + uVar39 * 4);
          auVar19 = *(undefined1 (*) [16])(lVar34 + uVar47 * 4);
          auVar54 = vunpcklps_avx(auVar52,auVar19);
          auVar67 = vunpckhps_avx(auVar52,auVar19);
          auVar52 = *(undefined1 (*) [16])(lVar34 + uVar42 * 4);
          auVar19 = *(undefined1 (*) [16])(lVar34 + uVar31 * 4);
          auVar69 = vunpcklps_avx(auVar52,auVar19);
          auVar52 = vunpckhps_avx(auVar52,auVar19);
          auVar19 = vunpcklps_avx(auVar67,auVar52);
          auVar67 = vunpcklps_avx(auVar54,auVar69);
          auVar52 = vunpckhps_avx(auVar54,auVar69);
          fVar16 = 1.0 - fVar96;
          auVar112._4_4_ = fVar16;
          auVar112._0_4_ = fVar16;
          auVar112._8_4_ = fVar16;
          auVar112._12_4_ = fVar16;
          auVar89._0_4_ = fVar96 * auVar55._0_4_;
          auVar89._4_4_ = fVar96 * auVar55._4_4_;
          auVar89._8_4_ = fVar96 * auVar55._8_4_;
          auVar89._12_4_ = fVar96 * auVar55._12_4_;
          auVar54 = vfmadd231ps_fma(auVar89,auVar112,auVar61);
          auVar105._0_4_ = fVar96 * auVar60._0_4_;
          auVar105._4_4_ = fVar96 * auVar60._4_4_;
          auVar105._8_4_ = fVar96 * auVar60._8_4_;
          auVar105._12_4_ = fVar96 * auVar60._12_4_;
          auVar60 = vfmadd231ps_fma(auVar105,auVar112,auVar3);
          auVar97._0_4_ = fVar96 * auVar77._0_4_;
          auVar97._4_4_ = fVar96 * auVar77._4_4_;
          auVar97._8_4_ = fVar96 * auVar77._8_4_;
          auVar97._12_4_ = fVar96 * auVar77._12_4_;
          auVar3 = vfmadd231ps_fma(auVar97,auVar112,auVar56);
          auVar85._0_4_ = fVar96 * auVar68._0_4_;
          auVar85._4_4_ = fVar96 * auVar68._4_4_;
          auVar85._8_4_ = fVar96 * auVar68._8_4_;
          auVar85._12_4_ = fVar96 * auVar68._12_4_;
          auVar77 = vfmadd231ps_fma(auVar85,auVar112,auVar53);
          auVar78._0_4_ = fVar96 * auVar66._0_4_;
          auVar78._4_4_ = fVar96 * auVar66._4_4_;
          auVar78._8_4_ = fVar96 * auVar66._8_4_;
          auVar78._12_4_ = fVar96 * auVar66._12_4_;
          auVar20 = vfmadd231ps_fma(auVar78,auVar112,auVar20);
          puVar1 = (undefined8 *)(uVar46 + 0x30 + lVar36);
          local_a00 = *puVar1;
          uStack_9f8 = puVar1[1];
          puVar1 = (undefined8 *)(uVar46 + 0x40 + lVar36);
          auVar61._0_4_ = fVar96 * auVar63._0_4_;
          auVar61._4_4_ = fVar96 * auVar63._4_4_;
          auVar61._8_4_ = fVar96 * auVar63._8_4_;
          auVar61._12_4_ = fVar96 * auVar63._12_4_;
          auVar66 = vfmadd231ps_fma(auVar61,auVar112,auVar72);
          auVar68._0_4_ = fVar96 * auVar67._0_4_;
          auVar68._4_4_ = fVar96 * auVar67._4_4_;
          auVar68._8_4_ = fVar96 * auVar67._8_4_;
          auVar68._12_4_ = fVar96 * auVar67._12_4_;
          auVar74._0_4_ = fVar96 * auVar52._0_4_;
          auVar74._4_4_ = fVar96 * auVar52._4_4_;
          auVar74._8_4_ = fVar96 * auVar52._8_4_;
          auVar74._12_4_ = fVar96 * auVar52._12_4_;
          auVar110._0_4_ = fVar96 * auVar19._0_4_;
          auVar110._4_4_ = fVar96 * auVar19._4_4_;
          auVar110._8_4_ = fVar96 * auVar19._8_4_;
          auVar110._12_4_ = fVar96 * auVar19._12_4_;
          auVar67 = vfmadd231ps_fma(auVar68,auVar112,auVar62);
          auVar51 = vfmadd231ps_fma(auVar74,auVar112,auVar51);
          auVar72 = vfmadd231ps_fma(auVar110,auVar112,auVar73);
          local_a10 = *puVar1;
          uStack_a08 = puVar1[1];
          local_9c0 = &local_c61;
          uVar37 = *(undefined4 *)(local_c48 + local_c50 * 4);
          auVar53._4_4_ = uVar37;
          auVar53._0_4_ = uVar37;
          auVar53._8_4_ = uVar37;
          auVar53._12_4_ = uVar37;
          uVar37 = *(undefined4 *)(local_c48 + local_c50 * 4 + 0x20);
          auVar113._4_4_ = uVar37;
          auVar113._0_4_ = uVar37;
          auVar113._8_4_ = uVar37;
          auVar113._12_4_ = uVar37;
          uVar37 = *(undefined4 *)(local_c48 + local_c50 * 4 + 0x40);
          auVar115._4_4_ = uVar37;
          auVar115._0_4_ = uVar37;
          auVar115._8_4_ = uVar37;
          auVar115._12_4_ = uVar37;
          local_b80 = vsubps_avx(auVar54,auVar53);
          local_c30 = vsubps_avx(auVar60,auVar113);
          local_c40 = vsubps_avx(auVar3,auVar115);
          auVar52 = vsubps_avx(auVar77,auVar53);
          auVar19 = vsubps_avx(auVar20,auVar113);
          auVar60 = vsubps_avx(auVar66,auVar115);
          auVar20 = vsubps_avx(auVar67,auVar53);
          auVar3 = vsubps_avx(auVar51,auVar113);
          auVar51 = vsubps_avx(auVar72,auVar115);
          local_b90 = vsubps_avx(auVar20,local_b80);
          local_bb0 = vsubps_avx(auVar3,local_c30);
          local_ba0 = vsubps_avx(auVar51,local_c40);
          auVar54._0_4_ = auVar20._0_4_ + local_b80._0_4_;
          auVar54._4_4_ = auVar20._4_4_ + local_b80._4_4_;
          auVar54._8_4_ = auVar20._8_4_ + local_b80._8_4_;
          auVar54._12_4_ = auVar20._12_4_ + local_b80._12_4_;
          auVar75._0_4_ = auVar3._0_4_ + local_c30._0_4_;
          auVar75._4_4_ = auVar3._4_4_ + local_c30._4_4_;
          auVar75._8_4_ = auVar3._8_4_ + local_c30._8_4_;
          auVar75._12_4_ = auVar3._12_4_ + local_c30._12_4_;
          fVar96 = local_c40._0_4_;
          auVar79._0_4_ = auVar51._0_4_ + fVar96;
          fVar16 = local_c40._4_4_;
          auVar79._4_4_ = auVar51._4_4_ + fVar16;
          fVar6 = local_c40._8_4_;
          auVar79._8_4_ = auVar51._8_4_ + fVar6;
          fVar7 = local_c40._12_4_;
          auVar79._12_4_ = auVar51._12_4_ + fVar7;
          auVar114._0_4_ = local_ba0._0_4_ * auVar75._0_4_;
          auVar114._4_4_ = local_ba0._4_4_ * auVar75._4_4_;
          auVar114._8_4_ = local_ba0._8_4_ * auVar75._8_4_;
          auVar114._12_4_ = local_ba0._12_4_ * auVar75._12_4_;
          auVar67 = vfmsub231ps_fma(auVar114,local_bb0,auVar79);
          auVar80._0_4_ = local_b90._0_4_ * auVar79._0_4_;
          auVar80._4_4_ = local_b90._4_4_ * auVar79._4_4_;
          auVar80._8_4_ = local_b90._8_4_ * auVar79._8_4_;
          auVar80._12_4_ = local_b90._12_4_ * auVar79._12_4_;
          auVar66 = vfmsub231ps_fma(auVar80,local_ba0,auVar54);
          auVar55._0_4_ = local_bb0._0_4_ * auVar54._0_4_;
          auVar55._4_4_ = local_bb0._4_4_ * auVar54._4_4_;
          auVar55._8_4_ = local_bb0._8_4_ * auVar54._8_4_;
          auVar55._12_4_ = local_bb0._12_4_ * auVar54._12_4_;
          auVar72 = vfmsub231ps_fma(auVar55,local_b90,auVar75);
          fStack_c5c = *(float *)(local_c48 + local_c50 * 4 + 0xc0);
          auVar69._0_4_ = fStack_c5c * auVar72._0_4_;
          auVar69._4_4_ = fStack_c5c * auVar72._4_4_;
          auVar69._8_4_ = fStack_c5c * auVar72._8_4_;
          auVar69._12_4_ = fStack_c5c * auVar72._12_4_;
          uVar37 = *(undefined4 *)(local_c48 + local_c50 * 4 + 0xa0);
          auVar106._4_4_ = uVar37;
          auVar106._0_4_ = uVar37;
          auVar106._8_4_ = uVar37;
          auVar106._12_4_ = uVar37;
          auVar66 = vfmadd231ps_fma(auVar69,auVar106,auVar66);
          uVar37 = *(undefined4 *)(local_c48 + local_c50 * 4 + 0x80);
          local_c10._4_4_ = uVar37;
          local_c10._0_4_ = uVar37;
          local_c10._8_4_ = uVar37;
          local_c10._12_4_ = uVar37;
          local_af0 = vfmadd231ps_fma(auVar66,local_c10,auVar67);
          local_ac0 = vsubps_avx(local_c30,auVar19);
          local_ae0 = vsubps_avx(local_c40,auVar60);
          auVar76._0_4_ = local_c30._0_4_ + auVar19._0_4_;
          auVar76._4_4_ = local_c30._4_4_ + auVar19._4_4_;
          auVar76._8_4_ = local_c30._8_4_ + auVar19._8_4_;
          auVar76._12_4_ = local_c30._12_4_ + auVar19._12_4_;
          auVar81._0_4_ = auVar60._0_4_ + fVar96;
          auVar81._4_4_ = auVar60._4_4_ + fVar16;
          auVar81._8_4_ = auVar60._8_4_ + fVar6;
          auVar81._12_4_ = auVar60._12_4_ + fVar7;
          fVar8 = local_ae0._0_4_;
          auVar90._0_4_ = auVar76._0_4_ * fVar8;
          fVar10 = local_ae0._4_4_;
          auVar90._4_4_ = auVar76._4_4_ * fVar10;
          fVar12 = local_ae0._8_4_;
          auVar90._8_4_ = auVar76._8_4_ * fVar12;
          fVar14 = local_ae0._12_4_;
          auVar90._12_4_ = auVar76._12_4_ * fVar14;
          auVar67 = vfmsub231ps_fma(auVar90,local_ac0,auVar81);
          local_ad0 = vsubps_avx(local_b80,auVar52);
          fVar116 = local_ad0._0_4_;
          auVar98._0_4_ = fVar116 * auVar81._0_4_;
          fVar118 = local_ad0._4_4_;
          auVar98._4_4_ = fVar118 * auVar81._4_4_;
          fVar119 = local_ad0._8_4_;
          auVar98._8_4_ = fVar119 * auVar81._8_4_;
          fVar120 = local_ad0._12_4_;
          auVar98._12_4_ = fVar120 * auVar81._12_4_;
          auVar82._0_4_ = local_b80._0_4_ + auVar52._0_4_;
          auVar82._4_4_ = local_b80._4_4_ + auVar52._4_4_;
          auVar82._8_4_ = local_b80._8_4_ + auVar52._8_4_;
          auVar82._12_4_ = local_b80._12_4_ + auVar52._12_4_;
          auVar66 = vfmsub231ps_fma(auVar98,local_ae0,auVar82);
          fVar9 = local_ac0._0_4_;
          auVar83._0_4_ = auVar82._0_4_ * fVar9;
          fVar11 = local_ac0._4_4_;
          auVar83._4_4_ = auVar82._4_4_ * fVar11;
          fVar13 = local_ac0._8_4_;
          auVar83._8_4_ = auVar82._8_4_ * fVar13;
          fVar15 = local_ac0._12_4_;
          auVar83._12_4_ = auVar82._12_4_ * fVar15;
          auVar72 = vfmsub231ps_fma(auVar83,local_ad0,auVar76);
          auVar84._0_4_ = fStack_c5c * auVar72._0_4_;
          auVar84._4_4_ = fStack_c5c * auVar72._4_4_;
          auVar84._8_4_ = fStack_c5c * auVar72._8_4_;
          auVar84._12_4_ = fStack_c5c * auVar72._12_4_;
          auVar66 = vfmadd231ps_fma(auVar84,auVar106,auVar66);
          local_9e0 = vfmadd231ps_fma(auVar66,local_c10,auVar67);
          auVar66 = vsubps_avx(auVar52,auVar20);
          auVar91._0_4_ = auVar20._0_4_ + auVar52._0_4_;
          auVar91._4_4_ = auVar20._4_4_ + auVar52._4_4_;
          auVar91._8_4_ = auVar20._8_4_ + auVar52._8_4_;
          auVar91._12_4_ = auVar20._12_4_ + auVar52._12_4_;
          auVar20 = vsubps_avx(auVar19,auVar3);
          auVar56._0_4_ = auVar19._0_4_ + auVar3._0_4_;
          auVar56._4_4_ = auVar19._4_4_ + auVar3._4_4_;
          auVar56._8_4_ = auVar19._8_4_ + auVar3._8_4_;
          auVar56._12_4_ = auVar19._12_4_ + auVar3._12_4_;
          auVar3 = vsubps_avx(auVar60,auVar51);
          auVar62._0_4_ = auVar60._0_4_ + auVar51._0_4_;
          auVar62._4_4_ = auVar60._4_4_ + auVar51._4_4_;
          auVar62._8_4_ = auVar60._8_4_ + auVar51._8_4_;
          auVar62._12_4_ = auVar60._12_4_ + auVar51._12_4_;
          auVar99._0_4_ = auVar56._0_4_ * auVar3._0_4_;
          auVar99._4_4_ = auVar56._4_4_ * auVar3._4_4_;
          auVar99._8_4_ = auVar56._8_4_ * auVar3._8_4_;
          auVar99._12_4_ = auVar56._12_4_ * auVar3._12_4_;
          auVar19 = vfmsub231ps_fma(auVar99,auVar20,auVar62);
          auVar63._0_4_ = auVar62._0_4_ * auVar66._0_4_;
          auVar63._4_4_ = auVar62._4_4_ * auVar66._4_4_;
          auVar63._8_4_ = auVar62._8_4_ * auVar66._8_4_;
          auVar63._12_4_ = auVar62._12_4_ * auVar66._12_4_;
          auVar52 = vfmsub231ps_fma(auVar63,auVar3,auVar91);
          auVar92._0_4_ = auVar20._0_4_ * auVar91._0_4_;
          auVar92._4_4_ = auVar20._4_4_ * auVar91._4_4_;
          auVar92._8_4_ = auVar20._8_4_ * auVar91._8_4_;
          auVar92._12_4_ = auVar20._12_4_ * auVar91._12_4_;
          auVar60 = vfmsub231ps_fma(auVar92,auVar66,auVar56);
          local_c60 = fStack_c5c;
          fStack_c58 = fStack_c5c;
          fStack_c54 = fStack_c5c;
          auVar93._0_4_ = fStack_c5c * auVar60._0_4_;
          auVar93._4_4_ = fStack_c5c * auVar60._4_4_;
          auVar93._8_4_ = fStack_c5c * auVar60._8_4_;
          auVar93._12_4_ = fStack_c5c * auVar60._12_4_;
          auVar52 = vfmadd231ps_fma(auVar93,auVar106,auVar52);
          auVar60 = vfmadd231ps_fma(auVar52,local_c10,auVar19);
          local_9f0 = local_af0._0_4_;
          fStack_9ec = local_af0._4_4_;
          fStack_9e8 = local_af0._8_4_;
          fStack_9e4 = local_af0._12_4_;
          local_9d0._0_4_ = auVar60._0_4_ + local_9f0 + local_9e0._0_4_;
          local_9d0._4_4_ = auVar60._4_4_ + fStack_9ec + local_9e0._4_4_;
          local_9d0._8_4_ = auVar60._8_4_ + fStack_9e8 + local_9e0._8_4_;
          local_9d0._12_4_ = auVar60._12_4_ + fStack_9e4 + local_9e0._12_4_;
          auVar117._8_4_ = 0x7fffffff;
          auVar117._0_8_ = 0x7fffffff7fffffff;
          auVar117._12_4_ = 0x7fffffff;
          auVar52 = vminps_avx(local_af0,local_9e0);
          auVar52 = vminps_avx(auVar52,auVar60);
          local_b00 = vandps_avx(local_9d0,auVar117);
          auVar107._0_4_ = local_b00._0_4_ * 1.1920929e-07;
          auVar107._4_4_ = local_b00._4_4_ * 1.1920929e-07;
          auVar107._8_4_ = local_b00._8_4_ * 1.1920929e-07;
          auVar107._12_4_ = local_b00._12_4_ * 1.1920929e-07;
          uVar35 = CONCAT44(auVar107._4_4_,auVar107._0_4_);
          auVar100._0_8_ = uVar35 ^ 0x8000000080000000;
          auVar100._8_4_ = -auVar107._8_4_;
          auVar100._12_4_ = -auVar107._12_4_;
          auVar52 = vcmpps_avx(auVar52,auVar100,5);
          auVar19 = vmaxps_avx(local_af0,local_9e0);
          auVar19 = vmaxps_avx(auVar19,auVar60);
          auVar19 = vcmpps_avx(auVar19,auVar107,2);
          auVar109 = ZEXT1664(local_bc0);
          local_c20 = vorps_avx(auVar52,auVar19);
          k = local_c50;
          ray = local_c48;
          if ((((local_c20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_c20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_c20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_c20[0xf] < '\0') {
            auVar64._0_4_ = fVar9 * local_ba0._0_4_;
            auVar64._4_4_ = fVar11 * local_ba0._4_4_;
            auVar64._8_4_ = fVar13 * local_ba0._8_4_;
            auVar64._12_4_ = fVar15 * local_ba0._12_4_;
            auVar94._0_4_ = fVar116 * local_bb0._0_4_;
            auVar94._4_4_ = fVar118 * local_bb0._4_4_;
            auVar94._8_4_ = fVar119 * local_bb0._8_4_;
            auVar94._12_4_ = fVar120 * local_bb0._12_4_;
            auVar60 = vfmsub213ps_fma(local_bb0,local_ae0,auVar64);
            auVar101._0_4_ = auVar20._0_4_ * fVar8;
            auVar101._4_4_ = auVar20._4_4_ * fVar10;
            auVar101._8_4_ = auVar20._8_4_ * fVar12;
            auVar101._12_4_ = auVar20._12_4_ * fVar14;
            auVar108._0_4_ = fVar116 * auVar3._0_4_;
            auVar108._4_4_ = fVar118 * auVar3._4_4_;
            auVar108._8_4_ = fVar119 * auVar3._8_4_;
            auVar108._12_4_ = fVar120 * auVar3._12_4_;
            auVar3 = vfmsub213ps_fma(auVar3,local_ac0,auVar101);
            auVar52 = vandps_avx(auVar117,auVar64);
            auVar19 = vandps_avx(auVar117,auVar101);
            auVar52 = vcmpps_avx(auVar52,auVar19,1);
            local_970 = vblendvps_avx(auVar3,auVar60,auVar52);
            auVar86._0_4_ = fVar9 * auVar66._0_4_;
            auVar86._4_4_ = fVar11 * auVar66._4_4_;
            auVar86._8_4_ = fVar13 * auVar66._8_4_;
            auVar86._12_4_ = fVar15 * auVar66._12_4_;
            auVar60 = vfmsub213ps_fma(auVar66,local_ae0,auVar108);
            auVar102._0_4_ = local_b90._0_4_ * fVar8;
            auVar102._4_4_ = local_b90._4_4_ * fVar10;
            auVar102._8_4_ = local_b90._8_4_ * fVar12;
            auVar102._12_4_ = local_b90._12_4_ * fVar14;
            auVar3 = vfmsub213ps_fma(local_ba0,local_ad0,auVar102);
            auVar52 = vandps_avx(auVar117,auVar102);
            auVar19 = vandps_avx(auVar108,auVar117);
            auVar52 = vcmpps_avx(auVar52,auVar19,1);
            auVar109 = ZEXT1664(local_bc0);
            local_960 = vblendvps_avx(auVar60,auVar3,auVar52);
            auVar60 = vfmsub213ps_fma(local_b90,local_ac0,auVar94);
            auVar20 = vfmsub213ps_fma(auVar20,local_ad0,auVar86);
            auVar52 = vandps_avx(auVar117,auVar94);
            auVar19 = vandps_avx(auVar117,auVar86);
            auVar52 = vcmpps_avx(auVar52,auVar19,1);
            local_950 = vblendvps_avx(auVar20,auVar60,auVar52);
            auVar87._0_4_ = local_950._0_4_ * fStack_c5c;
            auVar87._4_4_ = local_950._4_4_ * fStack_c5c;
            auVar87._8_4_ = local_950._8_4_ * fStack_c5c;
            auVar87._12_4_ = local_950._12_4_ * fStack_c5c;
            auVar52 = vfmadd213ps_fma(auVar106,local_960,auVar87);
            auVar52 = vfmadd213ps_fma(local_c10,local_970,auVar52);
            auVar88._0_4_ = auVar52._0_4_ + auVar52._0_4_;
            auVar88._4_4_ = auVar52._4_4_ + auVar52._4_4_;
            auVar88._8_4_ = auVar52._8_4_ + auVar52._8_4_;
            auVar88._12_4_ = auVar52._12_4_ + auVar52._12_4_;
            auVar95._0_4_ = local_950._0_4_ * fVar96;
            auVar95._4_4_ = local_950._4_4_ * fVar16;
            auVar95._8_4_ = local_950._8_4_ * fVar6;
            auVar95._12_4_ = local_950._12_4_ * fVar7;
            auVar52 = vfmadd213ps_fma(local_c30,local_960,auVar95);
            auVar19 = vfmadd213ps_fma(local_b80,local_970,auVar52);
            auVar52 = vrcpps_avx(auVar88);
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = &DAT_3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar60 = vfnmadd213ps_fma(auVar52,auVar88,auVar111);
            auVar52 = vfmadd132ps_fma(auVar60,auVar52,auVar52);
            local_980._0_4_ = auVar52._0_4_ * (auVar19._0_4_ + auVar19._0_4_);
            local_980._4_4_ = auVar52._4_4_ * (auVar19._4_4_ + auVar19._4_4_);
            local_980._8_4_ = auVar52._8_4_ * (auVar19._8_4_ + auVar19._8_4_);
            local_980._12_4_ = auVar52._12_4_ * (auVar19._12_4_ + auVar19._12_4_);
            uVar37 = *(undefined4 *)(local_c48 + local_c50 * 4 + 0x60);
            auVar103._4_4_ = uVar37;
            auVar103._0_4_ = uVar37;
            auVar103._8_4_ = uVar37;
            auVar103._12_4_ = uVar37;
            auVar52 = vcmpps_avx(auVar103,local_980,2);
            uVar37 = *(undefined4 *)(local_c48 + local_c50 * 4 + 0x100);
            auVar104._4_4_ = uVar37;
            auVar104._0_4_ = uVar37;
            auVar104._8_4_ = uVar37;
            auVar104._12_4_ = uVar37;
            auVar19 = vcmpps_avx(local_980,auVar104,2);
            auVar52 = vandps_avx(auVar19,auVar52);
            auVar19 = local_c20 & auVar52;
            if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar19[0xf] < '\0') {
              auVar52 = vandps_avx(auVar52,local_c20);
              auVar19 = vcmpps_avx(auVar88,_DAT_01feba10,4);
              auVar60 = auVar19 & auVar52;
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                local_9b0 = vandps_avx(auVar52,auVar19);
                local_9c0 = &local_c61;
                auVar52 = vrcpps_avx(local_9d0);
                auVar70._8_4_ = 0x3f800000;
                auVar70._0_8_ = &DAT_3f8000003f800000;
                auVar70._12_4_ = 0x3f800000;
                auVar19 = vfnmadd213ps_fma(local_9d0,auVar52,auVar70);
                auVar19 = vfmadd132ps_fma(auVar19,auVar52,auVar52);
                auVar65._8_4_ = 0x219392ef;
                auVar65._0_8_ = 0x219392ef219392ef;
                auVar65._12_4_ = 0x219392ef;
                auVar52 = vcmpps_avx(local_b00,auVar65,5);
                auVar52 = vandps_avx(auVar19,auVar52);
                auVar57._0_4_ = local_9f0 * auVar52._0_4_;
                auVar57._4_4_ = fStack_9ec * auVar52._4_4_;
                auVar57._8_4_ = fStack_9e8 * auVar52._8_4_;
                auVar57._12_4_ = fStack_9e4 * auVar52._12_4_;
                local_9a0 = vminps_avx(auVar57,auVar70);
                auVar58._0_4_ = auVar52._0_4_ * local_9e0._0_4_;
                auVar58._4_4_ = auVar52._4_4_ * local_9e0._4_4_;
                auVar58._8_4_ = auVar52._8_4_ * local_9e0._8_4_;
                auVar58._12_4_ = auVar52._12_4_ * local_9e0._12_4_;
                local_990 = vminps_avx(auVar58,auVar70);
                uVar43 = vmovmskps_avx(local_9b0);
                uVar35 = (ulong)uVar43;
                local_bc8 = pSVar38;
                do {
                  uVar39 = 0;
                  for (uVar40 = uVar35; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                      ) {
                    uVar39 = uVar39 + 1;
                  }
                  uVar43 = *(uint *)((long)&local_a00 + uVar39 * 4);
                  pGVar4 = (pSVar38->geometries).items[uVar43].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar35 = uVar35 ^ 1L << (uVar39 & 0x3f);
                    bVar50 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar50 = false;
                  }
                  else {
                    fVar96 = *(float *)(ray + k * 4 + 0x100);
                    uVar40 = (ulong)(uint)((int)uVar39 * 4);
                    local_8c0 = *(undefined4 *)(local_9a0 + uVar40);
                    uVar37 = *(undefined4 *)(local_990 + uVar40);
                    local_8a0._4_4_ = uVar37;
                    local_8a0._0_4_ = uVar37;
                    local_8a0._8_4_ = uVar37;
                    local_8a0._12_4_ = uVar37;
                    local_8a0._16_4_ = uVar37;
                    local_8a0._20_4_ = uVar37;
                    local_8a0._24_4_ = uVar37;
                    local_8a0._28_4_ = uVar37;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_980 + uVar40);
                    local_b50.context = context->user;
                    uVar37 = *(undefined4 *)((long)&local_a10 + uVar40);
                    local_880._4_4_ = uVar37;
                    local_880._0_4_ = uVar37;
                    local_880._8_4_ = uVar37;
                    local_880._12_4_ = uVar37;
                    local_880._16_4_ = uVar37;
                    local_880._20_4_ = uVar37;
                    local_880._24_4_ = uVar37;
                    local_880._28_4_ = uVar37;
                    uVar37 = *(undefined4 *)(local_970 + uVar40);
                    uVar2 = *(undefined4 *)(local_960 + uVar40);
                    local_900._4_4_ = uVar2;
                    local_900._0_4_ = uVar2;
                    local_900._8_4_ = uVar2;
                    local_900._12_4_ = uVar2;
                    local_900._16_4_ = uVar2;
                    local_900._20_4_ = uVar2;
                    local_900._24_4_ = uVar2;
                    local_900._28_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_950 + uVar40);
                    local_8e0._4_4_ = uVar2;
                    local_8e0._0_4_ = uVar2;
                    local_8e0._8_4_ = uVar2;
                    local_8e0._12_4_ = uVar2;
                    local_8e0._16_4_ = uVar2;
                    local_8e0._20_4_ = uVar2;
                    local_8e0._24_4_ = uVar2;
                    local_8e0._28_4_ = uVar2;
                    local_860._4_4_ = uVar43;
                    local_860._0_4_ = uVar43;
                    local_860._8_4_ = uVar43;
                    local_860._12_4_ = uVar43;
                    local_860._16_4_ = uVar43;
                    local_860._20_4_ = uVar43;
                    local_860._24_4_ = uVar43;
                    local_860._28_4_ = uVar43;
                    local_920[0] = (RTCHitN)(char)uVar37;
                    local_920[1] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[2] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[3] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_920[4] = (RTCHitN)(char)uVar37;
                    local_920[5] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[6] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[7] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_920[8] = (RTCHitN)(char)uVar37;
                    local_920[9] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[10] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[0xb] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_920[0xc] = (RTCHitN)(char)uVar37;
                    local_920[0xd] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[0xe] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[0xf] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_920[0x10] = (RTCHitN)(char)uVar37;
                    local_920[0x11] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[0x12] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[0x13] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_920[0x14] = (RTCHitN)(char)uVar37;
                    local_920[0x15] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[0x16] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[0x17] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_920[0x18] = (RTCHitN)(char)uVar37;
                    local_920[0x19] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[0x1a] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[0x1b] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_920[0x1c] = (RTCHitN)(char)uVar37;
                    local_920[0x1d] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_920[0x1e] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_920[0x1f] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    uStack_8bc = local_8c0;
                    uStack_8b8 = local_8c0;
                    uStack_8b4 = local_8c0;
                    uStack_8b0 = local_8c0;
                    uStack_8ac = local_8c0;
                    uStack_8a8 = local_8c0;
                    uStack_8a4 = local_8c0;
                    auVar59 = vpcmpeqd_avx2(local_860,local_860);
                    uStack_83c = (local_b50.context)->instID[0];
                    local_840 = uStack_83c;
                    uStack_838 = uStack_83c;
                    uStack_834 = uStack_83c;
                    uStack_830 = uStack_83c;
                    uStack_82c = uStack_83c;
                    uStack_828 = uStack_83c;
                    uStack_824 = uStack_83c;
                    uStack_81c = (local_b50.context)->instPrimID[0];
                    local_820 = uStack_81c;
                    uStack_818 = uStack_81c;
                    uStack_814 = uStack_81c;
                    uStack_810 = uStack_81c;
                    uStack_80c = uStack_81c;
                    uStack_808 = uStack_81c;
                    uStack_804 = uStack_81c;
                    local_b20 = local_940._0_8_;
                    uStack_b18 = local_940._8_8_;
                    uStack_b10 = local_940._16_8_;
                    uStack_b08 = local_940._24_8_;
                    local_b50.valid = (int *)&local_b20;
                    local_b50.geometryUserPtr = pGVar4->userPtr;
                    local_b50.hit = local_920;
                    local_b50.N = 8;
                    local_b50.ray = (RTCRayN *)ray;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      local_c60 = fVar96;
                      auVar59 = ZEXT1632(auVar59._0_16_);
                      (*pGVar4->occlusionFilterN)(&local_b50);
                      auVar59 = vpcmpeqd_avx2(auVar59,auVar59);
                      auVar109 = ZEXT1664(local_bc0);
                      k = local_c50;
                      pSVar38 = local_bc8;
                      ray = local_c48;
                      fVar96 = local_c60;
                    }
                    auVar18._8_8_ = uStack_b18;
                    auVar18._0_8_ = local_b20;
                    auVar18._16_8_ = uStack_b10;
                    auVar18._24_8_ = uStack_b08;
                    auVar17 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar18);
                    auVar18 = auVar59 & ~auVar17;
                    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar18 >> 0x7f,0) == '\0') &&
                          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar18 >> 0xbf,0) == '\0') &&
                        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar18[0x1f]) {
                      auVar17 = auVar17 ^ auVar59;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        local_c60 = fVar96;
                        auVar59 = ZEXT1632(auVar59._0_16_);
                        (*p_Var5)(&local_b50);
                        auVar59 = vpcmpeqd_avx2(auVar59,auVar59);
                        auVar109 = ZEXT1664(local_bc0);
                        k = local_c50;
                        ray = local_c48;
                        fVar96 = local_c60;
                      }
                      auVar17._8_8_ = uStack_b18;
                      auVar17._0_8_ = local_b20;
                      auVar17._16_8_ = uStack_b10;
                      auVar17._24_8_ = uStack_b08;
                      auVar18 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar17);
                      auVar17 = auVar18 ^ auVar59;
                      auVar71._8_4_ = 0xff800000;
                      auVar71._0_8_ = 0xff800000ff800000;
                      auVar71._12_4_ = 0xff800000;
                      auVar71._16_4_ = 0xff800000;
                      auVar71._20_4_ = 0xff800000;
                      auVar71._24_4_ = 0xff800000;
                      auVar71._28_4_ = 0xff800000;
                      auVar59 = vblendvps_avx(auVar71,*(undefined1 (*) [32])(local_b50.ray + 0x100),
                                              auVar18);
                      *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar59;
                    }
                    bVar27 = (auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar28 = (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar26 = (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar25 = SUB321(auVar17 >> 0x7f,0) == '\0';
                    bVar24 = (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar23 = SUB321(auVar17 >> 0xbf,0) == '\0';
                    bVar22 = (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar21 = -1 < auVar17[0x1f];
                    bVar50 = ((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) &&
                             bVar22) && bVar21;
                    if (((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) &&
                        bVar22) && bVar21) {
                      *(float *)(ray + k * 4 + 0x100) = fVar96;
                      uVar35 = uVar35 ^ 1L << (uVar39 & 0x3f);
                    }
                  }
                  if (!bVar50) {
                    uVar43 = 0;
                    uVar35 = local_bd8;
                    uVar39 = local_be0;
                    uVar40 = local_be8;
                    uVar42 = local_bf8;
                    uVar44 = local_c00;
                    uVar47 = local_bf0;
                    if (bVar49) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar43 = 1;
                    }
                    goto LAB_005e6c3b;
                  }
                } while (uVar35 != 0);
              }
            }
          }
          local_b60 = local_b60 + 1;
          bVar49 = local_b60 < local_b68;
        } while (local_b60 != local_b68);
        uVar43 = 0;
        uVar35 = local_bd8;
        uVar39 = local_be0;
        uVar40 = local_be8;
        uVar42 = local_bf8;
        uVar44 = local_c00;
        uVar47 = local_bf0;
      }
    }
LAB_005e6c3b:
    puVar29 = local_bd0;
  } while ((uVar43 & 3) == 0);
  return local_b58 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }